

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O3

string * __thiscall
Potassco::toString<Clasp::SolverStrategies::LbdMode,unsigned_int>
          (string *__return_storage_ptr__,Potassco *this,LbdMode *x,uint *y)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  string *psVar4;
  string res;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  lVar2 = 8;
  do {
    if (*(int *)(Clasp::enumMap(Clasp::SolverStrategies::LbdMode_const*)::map + lVar2) ==
        *(int *)this) break;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x38);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  uVar3 = std::__cxx11::string::append((char *)&local_38);
  std::__cxx11::string::_M_replace_aux(uVar3,*(ulong *)(uVar3 + 8),0,'\x01');
  psVar4 = xconvert(&local_38,*x);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& x, const U& y) {
	std::string res;
	xconvert(res, x).append(1, ',');
	return xconvert(res, y);
}